

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O2

void insert_region(int start,int last,REGION_TYPES type,REGIONS *regions,int *num_regions,
                  int *cur_region_idx)

{
  REGION_TYPES RVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined4 uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  REGIONS *pRVar11;
  REGIONS *pRVar12;
  int iVar13;
  long lVar14;
  uint uVar15;
  
  iVar9 = *cur_region_idx;
  lVar10 = (long)iVar9;
  RVar1 = regions[lVar10].type;
  iVar13 = regions[lVar10].last;
  uVar15 = (uint)(iVar13 != last) + (uint)(regions[lVar10].start != start);
  lVar14 = (long)*num_regions;
  pRVar12 = regions + lVar14;
  while( true ) {
    pRVar11 = pRVar12 + -1;
    lVar14 = lVar14 + -1;
    if (lVar14 <= lVar10) break;
    uVar6 = *(undefined4 *)&pRVar12[-1].field_0x34;
    pRVar12[(ulong)uVar15 - 1].type = pRVar12[-1].type;
    *(undefined4 *)&pRVar12[(ulong)uVar15 - 1].field_0x34 = uVar6;
    iVar7 = pRVar11->start;
    iVar8 = pRVar11->last;
    dVar2 = pRVar12[-1].avg_noise_var;
    dVar3 = pRVar12[-1].avg_cor_coeff;
    dVar4 = pRVar12[-1].avg_sr_fr_ratio;
    dVar5 = pRVar12[-1].avg_coded_err;
    pRVar12[(ulong)uVar15 - 1].avg_intra_err = pRVar12[-1].avg_intra_err;
    (&pRVar12[(ulong)uVar15 - 1].avg_intra_err)[1] = dVar5;
    pRVar12[(ulong)uVar15 - 1].avg_cor_coeff = dVar3;
    (&pRVar12[(ulong)uVar15 - 1].avg_cor_coeff)[1] = dVar4;
    pRVar12 = pRVar11 + uVar15;
    pRVar12->start = iVar7;
    pRVar12->last = iVar8;
    pRVar12->avg_noise_var = dVar2;
    pRVar12 = pRVar11;
  }
  *num_regions = *num_regions + uVar15;
  if (regions[lVar10].start < start) {
    regions[lVar10].last = start + -1;
    lVar10 = lVar10 + 1;
    regions[lVar10].start = start;
    iVar9 = (int)lVar10;
  }
  regions[lVar10].type = type;
  if (last < iVar13) {
    iVar9 = iVar9 + 1;
    regions[iVar9].start = last + 1;
    regions[iVar9].last = iVar13;
    regions[iVar9].type = RVar1;
    iVar13 = last;
  }
  regions[lVar10].last = iVar13;
  *cur_region_idx = iVar9;
  return;
}

Assistant:

static void insert_region(int start, int last, REGION_TYPES type,
                          REGIONS *regions, int *num_regions,
                          int *cur_region_idx) {
  int k = *cur_region_idx;
  REGION_TYPES this_region_type = regions[k].type;
  int this_region_last = regions[k].last;
  int num_add = (start != regions[k].start) + (last != regions[k].last);
  // move the following regions further to the back
  for (int r = *num_regions - 1; r > k; r--) {
    regions[r + num_add] = regions[r];
  }
  *num_regions += num_add;
  if (start > regions[k].start) {
    regions[k].last = start - 1;
    k++;
    regions[k].start = start;
  }
  regions[k].type = type;
  if (last < this_region_last) {
    regions[k].last = last;
    k++;
    regions[k].start = last + 1;
    regions[k].last = this_region_last;
    regions[k].type = this_region_type;
  } else {
    regions[k].last = this_region_last;
  }
  *cur_region_idx = k;
}